

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_optimize.cc
# Opt level: O0

void __thiscall
pass_dead_code_elimination_3_Test::~pass_dead_code_elimination_3_Test
          (pass_dead_code_elimination_3_Test *this)

{
  pass_dead_code_elimination_3_Test *this_local;
  
  ~pass_dead_code_elimination_3_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(pass, dead_code_elimination_3) {
    // cross boundary of modules
    Context ctx;
    auto &mod = ctx.generator("mod");
    auto &child = ctx.generator("child");
    mod.add_child_generator("inst", child);
    auto &in1 = child.port(PortDirection::In, "in1", 1);
    auto &in2 = child.port(PortDirection::In, "in2", 1);
    auto &v = child.var("v", 1);
    child.wire(v, in1 & in2);
    auto &v1 = mod.var("v1", 1);
    auto &v2 = mod.var("v2", 1);
    mod.wire(in1, v1);
    mod.wire(in2, v2);

    fix_assignment_type(&mod);
    verify_generator_connectivity(&mod);
    verify_assignments(&mod);

    dead_code_elimination(&mod);
    EXPECT_TRUE(mod.get_vars().empty());
    EXPECT_EQ(mod.get_child_generator_size(), 0);
}